

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# remove_dead_code.hpp
# Opt level: O0

bool __thiscall
optimization::remove_dead_code::Remove_Dead_Code::remove_dead_code
          (Remove_Dead_Code *this,shared_ptr<optimization::livevar_analyse::Block_Live_Var> *blv,
          BasicBlk *block,
          map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
          *vartable)

{
  bool bVar1;
  int iVar2;
  element_type *peVar3;
  pointer pIVar4;
  difference_type dVar5;
  size_type sVar6;
  iterator __x;
  element_type *peVar7;
  size_type sVar8;
  _Rb_tree_const_iterator<mir::inst::VarId> __first;
  element_type *this_00;
  long in_RDX;
  int in_stack_0000004c;
  Block_Live_Var *in_stack_00000050;
  int idx;
  mapped_type defvariable;
  VarId defvar;
  reverse_iterator riter;
  sharedPtrVariableSet tmp;
  bool modify;
  undefined7 in_stack_fffffffffffffe18;
  undefined1 in_stack_fffffffffffffe1f;
  Variable *in_stack_fffffffffffffe20;
  _Rb_tree_const_iterator<mir::inst::VarId> in_stack_fffffffffffffe28;
  _Rb_tree_const_iterator<mir::inst::VarId> __last;
  _Rb_tree_const_iterator<mir::inst::VarId> in_stack_fffffffffffffe30;
  const_iterator in_stack_fffffffffffffe38;
  key_type_conflict *in_stack_fffffffffffffe58;
  map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
  *in_stack_fffffffffffffe60;
  __normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
  local_c0;
  shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>
  *local_b8;
  shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>
  *local_b0;
  __normal_iterator<std::shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_*,_std::vector<std::shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>,_std::allocator<std::shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>_>
  local_a8 [2];
  int local_98;
  undefined4 local_94;
  unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *local_40;
  byte local_21;
  long local_18;
  
  local_21 = 0;
  local_18 = in_RDX;
  std::
  __shared_ptr_access<optimization::livevar_analyse::Block_Live_Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<optimization::livevar_analyse::Block_Live_Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x14351f);
  std::
  shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>
  ::shared_ptr((shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>
                *)in_stack_fffffffffffffe20,
               (shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>
                *)CONCAT17(in_stack_fffffffffffffe1f,in_stack_fffffffffffffe18));
  std::
  vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  ::rbegin((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
            *)in_stack_fffffffffffffe28._M_node);
  do {
    std::
    vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
    ::rend((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
            *)in_stack_fffffffffffffe28._M_node);
    bVar1 = std::operator!=((reverse_iterator<__gnu_cxx::__normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>_>
                             *)in_stack_fffffffffffffe20,
                            (reverse_iterator<__gnu_cxx::__normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>_>
                             *)CONCAT17(in_stack_fffffffffffffe1f,in_stack_fffffffffffffe18));
    if (!bVar1) {
      std::
      __shared_ptr_access<optimization::livevar_analyse::Block_Live_Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<optimization::livevar_analyse::Block_Live_Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x143a09);
      std::
      __shared_ptr_access<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x143a15);
      std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>::
      clear((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_> *
            )0x143a1d);
      peVar7 = std::
               __shared_ptr_access<optimization::livevar_analyse::Block_Live_Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<optimization::livevar_analyse::Block_Live_Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x143a2a);
      sVar8 = std::
              vector<std::shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>,_std::allocator<std::shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
              ::size(&peVar7->instLiveVars);
      if (sVar8 == 0) {
        std::
        __shared_ptr_access<optimization::livevar_analyse::Block_Live_Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<optimization::livevar_analyse::Block_Live_Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x143af0);
        this_00 = std::
                  __shared_ptr_access<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x143afc);
        std::
        __shared_ptr_access<optimization::livevar_analyse::Block_Live_Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<optimization::livevar_analyse::Block_Live_Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x143b0e);
        std::
        __shared_ptr_access<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x143b1a);
        std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>::
        begin((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
               *)CONCAT17(in_stack_fffffffffffffe1f,in_stack_fffffffffffffe18));
        std::
        __shared_ptr_access<optimization::livevar_analyse::Block_Live_Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<optimization::livevar_analyse::Block_Live_Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x143b37);
        std::
        __shared_ptr_access<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x143b43);
        std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>::
        end((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_> *
            )CONCAT17(in_stack_fffffffffffffe1f,in_stack_fffffffffffffe18));
        std::set<mir::inst::VarId,std::less<mir::inst::VarId>,std::allocator<mir::inst::VarId>>::
        insert<std::_Rb_tree_const_iterator<mir::inst::VarId>>
                  (this_00,in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
      }
      else {
        std::
        __shared_ptr_access<optimization::livevar_analyse::Block_Live_Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<optimization::livevar_analyse::Block_Live_Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x143a49);
        __first._M_node =
             (_Base_ptr)
             std::
             __shared_ptr_access<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x143a55);
        peVar7 = std::
                 __shared_ptr_access<optimization::livevar_analyse::Block_Live_Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<optimization::livevar_analyse::Block_Live_Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x143a67);
        __last._M_node = (_Base_ptr)0x0;
        std::
        vector<std::shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>,_std::allocator<std::shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
        ::operator[](&peVar7->instLiveVars,0);
        std::
        __shared_ptr_access<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x143a80);
        std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>::
        begin((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
               *)CONCAT17(in_stack_fffffffffffffe1f,in_stack_fffffffffffffe18));
        peVar7 = std::
                 __shared_ptr_access<optimization::livevar_analyse::Block_Live_Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<optimization::livevar_analyse::Block_Live_Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x143a9d);
        std::
        vector<std::shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>,_std::allocator<std::shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
        ::operator[](&peVar7->instLiveVars,(size_type)__last._M_node);
        std::
        __shared_ptr_access<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x143ab2);
        std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>::
        end((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_> *
            )CONCAT17(in_stack_fffffffffffffe1f,in_stack_fffffffffffffe18));
        std::set<mir::inst::VarId,std::less<mir::inst::VarId>,std::allocator<mir::inst::VarId>>::
        insert<std::_Rb_tree_const_iterator<mir::inst::VarId>>
                  ((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                    *)in_stack_fffffffffffffe20,__first,__last);
      }
      local_94 = 1;
      std::
      shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>
      ::~shared_ptr((shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>
                     *)0x143b94);
      return (bool)(local_21 & 1);
    }
    std::
    reverse_iterator<__gnu_cxx::__normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>_>
    ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>_>
                  *)in_stack_fffffffffffffe20);
    std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>::get
              ((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
               in_stack_fffffffffffffe20);
    mir::inst::VarId::VarId
              ((VarId *)in_stack_fffffffffffffe20,
               (VarId *)CONCAT17(in_stack_fffffffffffffe1f,in_stack_fffffffffffffe18));
    std::
    map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
    ::operator[](in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
    mir::inst::Variable::Variable
              (in_stack_fffffffffffffe20,
               (Variable *)CONCAT17(in_stack_fffffffffffffe1f,in_stack_fffffffffffffe18));
    peVar3 = std::__shared_ptr_access<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x143614);
    iVar2 = (*(peVar3->super_Displayable)._vptr_Displayable[1])();
    if (iVar2 == 1) {
LAB_001436b3:
      std::
      reverse_iterator<__gnu_cxx::__normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>_>
      ::operator++((reverse_iterator<__gnu_cxx::__normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>_>
                    *)in_stack_fffffffffffffe28._M_node,
                   (int)((ulong)in_stack_fffffffffffffe20 >> 0x20));
      local_94 = 3;
    }
    else {
      std::
      reverse_iterator<__gnu_cxx::__normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>_>
      ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>_>
                    *)in_stack_fffffffffffffe20);
      pIVar4 = std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>::get
                         ((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                          in_stack_fffffffffffffe20);
      iVar2 = (*(pIVar4->super_Displayable)._vptr_Displayable[1])();
      if (iVar2 == 4) goto LAB_001436b3;
      std::
      reverse_iterator<__gnu_cxx::__normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>_>
      ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>_>
                    *)in_stack_fffffffffffffe20);
      pIVar4 = std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>::get
                         ((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                          in_stack_fffffffffffffe20);
      iVar2 = (*(pIVar4->super_Displayable)._vptr_Displayable[1])();
      if (iVar2 == 6) goto LAB_001436b3;
      std::
      vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
      ::rend((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
              *)in_stack_fffffffffffffe28._M_node);
      dVar5 = std::operator-((reverse_iterator<__gnu_cxx::__normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>_>
                              *)in_stack_fffffffffffffe30._M_node,
                             (reverse_iterator<__gnu_cxx::__normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>_>
                              *)in_stack_fffffffffffffe28._M_node);
      local_98 = (int)dVar5 + -1;
      peVar7 = std::
               __shared_ptr_access<optimization::livevar_analyse::Block_Live_Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<optimization::livevar_analyse::Block_Live_Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x143780);
      sVar8 = std::
              vector<std::shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>,_std::allocator<std::shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
              ::size(&peVar7->instLiveVars);
      if ((ulong)(long)(int)dVar5 < sVar8) {
        std::
        __shared_ptr_access<optimization::livevar_analyse::Block_Live_Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<optimization::livevar_analyse::Block_Live_Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x1437c5);
        local_b8 = (shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>
                    *)std::
                      vector<std::shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>,_std::allocator<std::shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
                      ::begin((vector<std::shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>,_std::allocator<std::shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
                               *)CONCAT17(in_stack_fffffffffffffe1f,in_stack_fffffffffffffe18));
        local_b0 = (shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>
                    *)__gnu_cxx::
                      __normal_iterator<std::shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_*,_std::vector<std::shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>,_std::allocator<std::shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>_>
                      ::operator+((__normal_iterator<std::shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_*,_std::vector<std::shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>,_std::allocator<std::shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>_>
                                   *)in_stack_fffffffffffffe28._M_node,
                                  (difference_type)in_stack_fffffffffffffe20);
        local_a8[0] = __gnu_cxx::
                      __normal_iterator<std::shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_*,_std::vector<std::shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>,_std::allocator<std::shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>_>
                      ::operator+((__normal_iterator<std::shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_*,_std::vector<std::shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>,_std::allocator<std::shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>_>
                                   *)in_stack_fffffffffffffe28._M_node,
                                  (difference_type)in_stack_fffffffffffffe20);
        __gnu_cxx::
        __normal_iterator<std::shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_*,_std::vector<std::shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>,_std::allocator<std::shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>_>
        ::operator*(local_a8);
        std::
        shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>
        ::operator=((shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>
                     *)in_stack_fffffffffffffe20,
                    (shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>
                     *)CONCAT17(in_stack_fffffffffffffe1f,in_stack_fffffffffffffe18));
      }
      else {
        std::
        __shared_ptr_access<optimization::livevar_analyse::Block_Live_Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<optimization::livevar_analyse::Block_Live_Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x1437a2);
        std::
        shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>
        ::operator=((shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>
                     *)in_stack_fffffffffffffe20,
                    (shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>
                     *)CONCAT17(in_stack_fffffffffffffe1f,in_stack_fffffffffffffe18));
      }
      std::
      __shared_ptr_access<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x143836);
      sVar6 = std::
              set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
              ::count((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                       *)in_stack_fffffffffffffe30._M_node,
                      (key_type *)in_stack_fffffffffffffe28._M_node);
      if (sVar6 == 0) {
        in_stack_fffffffffffffe58 = (key_type_conflict *)(local_18 + 0x40);
        in_stack_fffffffffffffe60 =
             (map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
              *)std::
                reverse_iterator<__gnu_cxx::__normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>_>
                ::operator++((reverse_iterator<__gnu_cxx::__normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>_>
                              *)in_stack_fffffffffffffe20);
        std::
        reverse_iterator<__gnu_cxx::__normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>_>
        ::base((reverse_iterator<__gnu_cxx::__normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>_>
                *)in_stack_fffffffffffffe60);
        __gnu_cxx::
        __normal_iterator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>const*,std::vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>>
        ::__normal_iterator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>*>
                  ((__normal_iterator<const_std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
                    *)in_stack_fffffffffffffe20,
                   (__normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
                    *)CONCAT17(in_stack_fffffffffffffe1f,in_stack_fffffffffffffe18));
        __x = std::
              vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
              ::erase((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                       *)in_stack_fffffffffffffe30._M_node,
                      (const_iterator)in_stack_fffffffffffffe38._M_current);
        std::
        reverse_iterator<__gnu_cxx::__normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>_>
        ::reverse_iterator((reverse_iterator<__gnu_cxx::__normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>_>
                            *)&local_c0,(iterator_type)__x._M_current);
        local_40 = local_c0._M_current;
        in_stack_fffffffffffffe38._M_current =
             (shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>
              *)std::
                __shared_ptr_access<optimization::livevar_analyse::Block_Live_Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<optimization::livevar_analyse::Block_Live_Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)0x14390e);
        std::
        __shared_ptr_access<optimization::livevar_analyse::Block_Live_Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<optimization::livevar_analyse::Block_Live_Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x143920);
        std::
        vector<std::shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>,_std::allocator<std::shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
        ::begin((vector<std::shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>,_std::allocator<std::shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
                 *)CONCAT17(in_stack_fffffffffffffe1f,in_stack_fffffffffffffe18));
        __gnu_cxx::
        __normal_iterator<std::shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_*,_std::vector<std::shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>,_std::allocator<std::shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>_>
        ::operator+((__normal_iterator<std::shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_*,_std::vector<std::shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>,_std::allocator<std::shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>_>
                     *)in_stack_fffffffffffffe28._M_node,(difference_type)in_stack_fffffffffffffe20)
        ;
        __gnu_cxx::
        __normal_iterator<std::shared_ptr<std::set<mir::inst::VarId,std::less<mir::inst::VarId>,std::allocator<mir::inst::VarId>>>const*,std::vector<std::shared_ptr<std::set<mir::inst::VarId,std::less<mir::inst::VarId>,std::allocator<mir::inst::VarId>>>,std::allocator<std::shared_ptr<std::set<mir::inst::VarId,std::less<mir::inst::VarId>,std::allocator<mir::inst::VarId>>>>>>
        ::
        __normal_iterator<std::shared_ptr<std::set<mir::inst::VarId,std::less<mir::inst::VarId>,std::allocator<mir::inst::VarId>>>*>
                  ((__normal_iterator<const_std::shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_*,_std::vector<std::shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>,_std::allocator<std::shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>_>
                    *)in_stack_fffffffffffffe20,
                   (__normal_iterator<std::shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_*,_std::vector<std::shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>,_std::allocator<std::shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>_>
                    *)CONCAT17(in_stack_fffffffffffffe1f,in_stack_fffffffffffffe18));
        std::
        vector<std::shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>,_std::allocator<std::shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
        ::erase((vector<std::shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>,_std::allocator<std::shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
                 *)in_stack_fffffffffffffe30._M_node,in_stack_fffffffffffffe38);
        std::
        __shared_ptr_access<optimization::livevar_analyse::Block_Live_Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<optimization::livevar_analyse::Block_Live_Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x143995);
        livevar_analyse::Block_Live_Var::update(in_stack_00000050,in_stack_0000004c);
        local_21 = 1;
      }
      else {
        std::
        reverse_iterator<__gnu_cxx::__normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>_>
        ::operator++((reverse_iterator<__gnu_cxx::__normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>_>
                      *)in_stack_fffffffffffffe28._M_node,
                     (int)((ulong)in_stack_fffffffffffffe20 >> 0x20));
      }
      local_94 = 0;
    }
    mir::inst::Variable::~Variable((Variable *)0x1439e5);
  } while( true );
}

Assistant:

bool remove_dead_code(std::shared_ptr<livevar_analyse::Block_Live_Var> blv,
                        mir::inst::BasicBlk& block,
                        std::map<uint32_t, mir::inst::Variable>& vartable) {
    bool modify = false;
    auto tmp = blv->live_vars_out;
    for (auto riter = block.inst.rbegin(); riter != block.inst.rend();) {
      auto defvar = riter->get()->dest;
      auto defvariable = vartable[defvar.id];
      if (defvariable.ty->kind() == mir::types::TyKind::Void ||
          riter->get()->inst_kind() == mir::inst::InstKind::Store ||
          riter->get()->inst_kind() == mir::inst::InstKind::Call) {
        riter++;
        continue;
      }
      int idx = block.inst.rend() - riter - 1;
      if (idx + 1 >= blv->instLiveVars.size()) {  // remove the last code
        tmp = blv->live_vars_out;
      } else {
        tmp = *(blv->instLiveVars.begin() + idx + 1);
      }
      if (!tmp->count(defvar)) {
        riter = std::vector<std::unique_ptr<mir::inst::Inst>>::reverse_iterator(
            block.inst.erase((++riter).base()));
        blv->instLiveVars.erase(blv->instLiveVars.begin() + idx);
        // vartable.erase(defvar.id);
        blv->update(idx - 1);
        modify = true;
      } else {
        riter++;
      }
    }
    // if (modify) {
    //   build(live_vars_out, block);
    // }
    blv->live_vars_in->clear();
    if (blv->instLiveVars.size()) {
      blv->live_vars_in->insert(blv->instLiveVars[0]->begin(),
                                blv->instLiveVars[0]->end());
    } else {  // Maybe the block's codes are all dead
      blv->live_vars_in->insert(blv->live_vars_out->begin(),
                                blv->live_vars_out->end());
    }
    return modify;
  }